

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

Argument * __thiscall
argparse::ArgumentParser::add_argument<char_const*>(ArgumentParser *this,char *Fargs)

{
  int __fdin;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  iterator this_01;
  pointer pAVar1;
  list<argparse::Argument,_std::allocator<argparse::Argument>_> *__cont;
  reference pAVar3;
  list_iterator in_RSI;
  char *in_RDI;
  __off64_t *in_R8;
  size_t in_R9;
  iterator tArgument;
  list<argparse::Argument,_std::allocator<argparse::Argument>_> *in_stack_ffffffffffffff98;
  basic_string_view<char,_std::char_traits<char>_> (*in_stack_ffffffffffffffb8) [1];
  int __fdout;
  _List_const_iterator<argparse::Argument> in_stack_ffffffffffffffc0;
  const_iterator in_stack_ffffffffffffffc8;
  const_iterator cVar2;
  
  this_00 = (basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0x98);
  std::cend<std::__cxx11::list<argparse::Argument,std::allocator<argparse::Argument>>>
            (in_stack_ffffffffffffff98);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,in_RDI);
  this_01 = std::__cxx11::list<argparse::Argument,std::allocator<argparse::Argument>>::
            emplace<std::basic_string_view<char,std::char_traits<char>>[1]>
                      (in_stack_ffffffffffffffc0._M_node,in_stack_ffffffffffffffc8,
                       in_stack_ffffffffffffffb8);
  __fdout = (int)in_stack_ffffffffffffffc0._M_node;
  pAVar1 = std::_List_iterator<argparse::Argument>::operator->
                     ((_List_iterator<argparse::Argument> *)0x11fbf9);
  if ((pAVar1->field_0xac & 1) == 0) {
    __cont = (list<argparse::Argument,_std::allocator<argparse::Argument>_> *)(in_RDI + 0x80);
    cVar2 = std::cend<std::__cxx11::list<argparse::Argument,std::allocator<argparse::Argument>>>
                      (__cont);
    __fdin = (int)cVar2._M_node;
    std::_List_const_iterator<argparse::Argument>::_List_const_iterator
              ((_List_const_iterator<argparse::Argument> *)&stack0xffffffffffffffc0,
               (iterator *)&stack0xffffffffffffffe8);
    std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::splice
              (__cont,__fdin,(__off64_t *)(in_RDI + 0x98),__fdout,in_R8,in_R9,(uint)__cont);
  }
  index_argument((ArgumentParser *)this_01._M_node,in_RSI);
  pAVar3 = std::_List_iterator<argparse::Argument>::operator*
                     ((_List_iterator<argparse::Argument> *)0x11fc85);
  return pAVar3;
}

Assistant:

Argument &add_argument(Targs... Fargs) {
    using array_of_sv = std::string_view[sizeof...(Targs)];
    auto tArgument = mOptionalArguments.emplace(cend(mOptionalArguments),
                                                array_of_sv{Fargs...});

    if (!tArgument->mIsOptional)
      mPositionalArguments.splice(cend(mPositionalArguments),
                                  mOptionalArguments, tArgument);

    index_argument(tArgument);
    return *tArgument;
  }